

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O2

Node<label::JSONLabel> * __thiscall
parser::BracketNotationParser<label::JSONLabel>::parse_single
          (Node<label::JSONLabel> *__return_storage_ptr__,
          BracketNotationParser<label::JSONLabel> *this,string *tree_string)

{
  pointer *pprVar1;
  string *__rhs;
  Node<label::JSONLabel> *this_00;
  __type _Var2;
  __type _Var3;
  long lVar4;
  pointer pbVar5;
  pointer pbVar6;
  reference_wrapper<node::Node<label::JSONLabel>_> local_140;
  string match_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  JSONLabel root_label;
  Node<label::JSONLabel> n;
  JSONLabel node_label;
  Node<label::JSONLabel> local_70;
  
  get_tokens(&tokens,this,tree_string);
  pbVar5 = tokens.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  std::__cxx11::string::string((string *)&match_str,(string *)pbVar5);
  __rhs = &this->kLeftBracket;
  _Var2 = std::operator==(&match_str,__rhs);
  if ((_Var2) || (_Var2 = std::operator==(&match_str,&this->kRightBracket), _Var2)) {
    std::__cxx11::string::assign((char *)&match_str);
  }
  else {
    pbVar5 = tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
  }
  label::JSONLabel::JSONLabel(&root_label,&match_str);
  node::Node<label::JSONLabel>::Node(__return_storage_ptr__,&root_label);
  n.children_.
  super__Vector_base<node::Node<label::JSONLabel>,_std::allocator<node::Node<label::JSONLabel>_>_>.
  _M_impl.super__Vector_impl_data._M_start = __return_storage_ptr__;
  std::
  vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
  ::emplace_back<std::reference_wrapper<node::Node<label::JSONLabel>>>
            ((vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
              *)this,(reference_wrapper<node::Node<label::JSONLabel>_> *)&n);
  for (; pbVar5 != tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      pbVar5 = (pointer)((long)&(pbVar5->_M_dataplus)._M_p + lVar4)) {
    std::__cxx11::string::_M_assign((string *)&match_str);
    _Var2 = std::operator==(&match_str,__rhs);
    if (_Var2) {
      pbVar6 = pbVar5 + 1;
      std::__cxx11::string::_M_assign((string *)&match_str);
      _Var3 = std::operator==(&match_str,__rhs);
      if ((_Var3) || (_Var3 = std::operator==(&match_str,&this->kRightBracket), _Var3)) {
        std::__cxx11::string::assign((char *)&match_str);
      }
      else {
        pbVar6 = pbVar5 + 2;
      }
      label::JSONLabel::JSONLabel(&node_label,&match_str);
      node::Node<label::JSONLabel>::Node(&n,&node_label);
      this_00 = (this->node_stack).
                super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
      node::Node<label::JSONLabel>::Node(&local_70,&n);
      local_140._M_data = node::Node<label::JSONLabel>::add_child(this_00,&local_70);
      std::
      vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
      ::emplace_back<std::reference_wrapper<node::Node<label::JSONLabel>>>
                ((vector<std::reference_wrapper<node::Node<label::JSONLabel>>,std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>>>>
                  *)this,&local_140);
      node::Node<label::JSONLabel>::~Node(&local_70);
      node::Node<label::JSONLabel>::~Node(&n);
      std::__cxx11::string::~string((string *)&node_label);
      pbVar5 = pbVar6;
    }
    _Var3 = std::operator==(&match_str,&this->kRightBracket);
    if (_Var3) {
      pprVar1 = &(this->node_stack).
                 super__Vector_base<std::reference_wrapper<node::Node<label::JSONLabel>_>,_std::allocator<std::reference_wrapper<node::Node<label::JSONLabel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pprVar1 = *pprVar1 + -1;
      lVar4 = 0x20;
    }
    else {
      lVar4 = (ulong)!_Var2 << 5;
    }
  }
  std::__cxx11::string::~string((string *)&root_label);
  std::__cxx11::string::~string((string *)&match_str);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&tokens);
  return __return_storage_ptr__;
}

Assistant:

node::Node<Label> BracketNotationParser<Label>::parse_single(
    const std::string& tree_string) {

  std::vector<std::string> tokens = get_tokens(tree_string);

  // Tokenize the input string - get iterator over tokens.
  auto tokens_begin = tokens.begin();
  auto tokens_end = tokens.end();

  // Deal with the root node separately.
  ++tokens_begin; // Advance tokens to label.
  std::string match_str = *tokens_begin;
  if (match_str == kLeftBracket || match_str == kRightBracket) { // Root has an empty label.
    match_str = "";
    // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
  } else { // Non-empty label.
    ++tokens_begin; // Advance tokens.
  }
  Label root_label(match_str);
  node::Node<Label> root(root_label);
  node_stack.push_back(std::ref(root));

  bool consumed_token = false;

  // Iterate all remaining tokens.
  while (tokens_begin != tokens_end) {
    match_str = *tokens_begin;
    consumed_token = false;

    if (match_str == kLeftBracket) { // Enter node.
      consumed_token = true;
      ++tokens_begin; // Advance tokens to label.
      match_str = *tokens_begin;

      if (match_str == kLeftBracket || match_str == kRightBracket) { // Node has an empty label.
        match_str = "";
        // Do not advance tokens - we're already at kLeftBracket or kRightBracket.
      } else { // Non-empty label.
        ++tokens_begin; // Advance tokens.
      }

      // Create new node.
      Label node_label(match_str);
      node::Node<Label> n(node_label);

      // Move n to become a child.
      // Return reference from add_child to the 'new-located' object.
      // Put a reference to just-moved n (last child of its parent) on a stack.
      node_stack.push_back(std::ref(node_stack.back().get().add_child(n)));
    }

    if (match_str == kRightBracket) { // Exit node.
      consumed_token = true;
      node_stack.pop_back();
      ++tokens_begin; // Advance tokens.
    }

    // Skip incorrect token.
    if (consumed_token == false) {
      ++tokens_begin; // Advance tokens.
    }
  }
  return root;
}